

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_net.cpp
# Opt level: O1

int __thiscall Net::predict(Net *this,Table *input)

{
  pointer pdVar1;
  pointer pvVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  double dVar8;
  
  pvVar2 = (this->mesh).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data + 8) !=
      (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar7 = 0;
    do {
      dVar8 = Table::get_value(input,(int)uVar7,0);
      pvVar2 = (this->mesh).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = *(long *)&(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data;
      *(double *)(lVar4 + uVar7 * 8) = dVar8;
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)((long)*(pointer *)
                                    ((long)&(pvVar2->
                                            super__Vector_base<double,_std::allocator<double>_>).
                                            _M_impl.super__Vector_impl_data + 8) - lVar4 >> 3));
  }
  pvVar2 = (this->mesh).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (1 < (int)((ulong)((long)pvVar2 -
                       (long)(this->mesh).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
    iVar5 = 1;
    do {
      propagate_front(this,iVar5);
      pvVar2 = (this->mesh).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      iVar5 = iVar5 + 1;
      iVar3 = (int)((ulong)((long)pvVar2 -
                           (long)(this->mesh).
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3);
    } while (SBORROW4(iVar5,iVar3 * -0x55555555) != iVar5 + iVar3 * 0x55555555 < 0);
  }
  pdVar1 = pvVar2[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)pvVar2[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar1;
  if (lVar4 == 0) {
    iVar5 = 0;
  }
  else {
    lVar4 = lVar4 >> 3;
    lVar6 = 0;
    iVar5 = 0;
    do {
      iVar3 = (int)lVar6;
      if (pdVar1[lVar6] < pdVar1[iVar5] || pdVar1[lVar6] == pdVar1[iVar5]) {
        iVar3 = iVar5;
      }
      iVar5 = iVar3;
      lVar6 = lVar6 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar6);
  }
  return iVar5;
}

Assistant:

int Net::predict(Table input){
    for (int x = 0; x < mesh[0].size(); ++x)
        mesh[0][x] = input.get_value(x, 0);
    for (int layer = 1; layer < (int)mesh.size(); ++layer)
        propagate_front(layer);

    int maxx = 0;
    for (int i = 0; i < mesh.back().size(); ++i)
        if (mesh.back()[maxx] < mesh.back()[i]) maxx = i;
    return maxx;
}